

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t linear_hash_write_state(linear_hash_table_t *linear_hash)

{
  int iVar1;
  void *__src;
  FILE *__s;
  long lVar2;
  undefined1 *puVar3;
  size_t sVar4;
  undefined8 uStack_30;
  undefined1 auStack_28 [8];
  undefined1 *local_20;
  ion_byte_t *cached_bucket_map;
  linear_hash_table_t *linear_hash_local;
  
  uStack_30 = 0x111d5b;
  cached_bucket_map = (ion_byte_t *)linear_hash;
  sVar4 = fwrite(&linear_hash->initial_size,4,1,(FILE *)linear_hash->state);
  if (sVar4 == 1) {
    uStack_30 = 0x111d90;
    sVar4 = fwrite(cached_bucket_map + 0x28,4,1,*(FILE **)(cached_bucket_map + 0x50));
    if (sVar4 == 1) {
      uStack_30 = 0x111dc5;
      sVar4 = fwrite(cached_bucket_map + 0x2c,4,1,*(FILE **)(cached_bucket_map + 0x50));
      if (sVar4 == 1) {
        uStack_30 = 0x111dfa;
        sVar4 = fwrite(cached_bucket_map + 0x30,4,1,*(FILE **)(cached_bucket_map + 0x50));
        if (sVar4 == 1) {
          uStack_30 = 0x111e2f;
          sVar4 = fwrite(cached_bucket_map + 0x34,4,1,*(FILE **)(cached_bucket_map + 0x50));
          if (sVar4 == 1) {
            uStack_30 = 0x111e64;
            sVar4 = fwrite(cached_bucket_map + 0x38,4,1,*(FILE **)(cached_bucket_map + 0x50));
            if (sVar4 == 1) {
              uStack_30 = 0x111e99;
              sVar4 = fwrite(*(void **)(cached_bucket_map + 0x58),4,1,
                             *(FILE **)(cached_bucket_map + 0x50));
              if (sVar4 == 1) {
                lVar2 = -((long)**(int **)(cached_bucket_map + 0x58) * 8 + 0xfU & 0xfffffffffffffff0
                         );
                iVar1 = **(int **)(cached_bucket_map + 0x58);
                local_20 = auStack_28 + lVar2;
                *(undefined8 *)(auStack_28 + lVar2 + -8) = 0x111eed;
                memset(auStack_28 + lVar2,0,(long)iVar1 << 3);
                puVar3 = local_20;
                __src = *(void **)(*(long *)(cached_bucket_map + 0x58) + 8);
                iVar1 = *(int *)(cached_bucket_map + 0x30);
                *(undefined8 *)(auStack_28 + lVar2 + -8) = 0x111f0e;
                memcpy(puVar3,__src,(long)iVar1 << 3);
                puVar3 = local_20;
                __s = *(FILE **)(cached_bucket_map + 0x50);
                *(undefined8 *)(auStack_28 + lVar2 + -8) = 0x111f29;
                sVar4 = fwrite(puVar3,8,1,__s);
                if (sVar4 == 1) {
                  linear_hash_local._7_1_ = '\0';
                }
                else {
                  linear_hash_local._7_1_ = '\a';
                }
              }
              else {
                linear_hash_local._7_1_ = '\a';
              }
            }
            else {
              linear_hash_local._7_1_ = '\a';
            }
          }
          else {
            linear_hash_local._7_1_ = '\a';
          }
        }
        else {
          linear_hash_local._7_1_ = '\a';
        }
      }
      else {
        linear_hash_local._7_1_ = '\a';
      }
    }
    else {
      linear_hash_local._7_1_ = '\a';
    }
  }
  else {
    linear_hash_local._7_1_ = '\a';
  }
  return linear_hash_local._7_1_;
}

Assistant:

ion_err_t
linear_hash_write_state(
	linear_hash_table_t *linear_hash
) {
	if (1 != fwrite(&linear_hash->initial_size, sizeof(linear_hash->initial_size), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->next_split, sizeof(linear_hash->next_split), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->split_threshold, sizeof(linear_hash->split_threshold), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->num_buckets, sizeof(linear_hash->num_buckets), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->num_records, sizeof(linear_hash->num_records), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->records_per_bucket, sizeof(linear_hash->records_per_bucket), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	if (1 != fwrite(&linear_hash->bucket_map->current_size, sizeof(int), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	ion_byte_t *cached_bucket_map = alloca(sizeof(ion_fpos_t) * linear_hash->bucket_map->current_size);

	memset(cached_bucket_map, 0, sizeof(ion_fpos_t) * linear_hash->bucket_map->current_size);
	memcpy(cached_bucket_map, linear_hash->bucket_map->data, linear_hash->num_buckets * sizeof(ion_fpos_t));

	if (1 != fwrite(cached_bucket_map, sizeof(linear_hash->bucket_map->data), 1, linear_hash->state)) {
		return err_file_write_error;
	}

	return err_ok;
}